

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skew.cpp
# Opt level: O0

void duckdb::SkewnessOperation::Finalize<double,duckdb::SkewState>
               (SkewState *state,double *target,AggregateFinalizeData *finalize_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  OutOfRangeException *this;
  double *in_RSI;
  ulong *in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double temp1;
  double div;
  __type_conflict1 p;
  double temp;
  double n;
  undefined8 in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  allocator *paVar11;
  allocator local_61;
  string local_60 [16];
  AggregateFinalizeData *in_stack_ffffffffffffffb0;
  double local_30;
  
  if (*in_RDI < 3) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffb0);
  }
  else {
    uVar4 = *in_RDI;
    auVar10._8_4_ = (int)(uVar4 >> 0x20);
    auVar10._0_8_ = uVar4;
    auVar10._12_4_ = 0x45300000;
    dVar5 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
    dVar6 = 1.0 / dVar5;
    local_30 = std::pow<double,int>
                         (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20))
    ;
    if (local_30 < 0.0) {
      local_30 = 0.0;
    }
    dVar7 = sqrt(local_30);
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      dVar8 = sqrt(dVar5 * (dVar5 - 1.0));
      dVar1 = (double)in_RDI[3];
      dVar2 = (double)in_RDI[2];
      dVar3 = (double)in_RDI[1];
      dVar9 = pow((double)in_RDI[1],3.0);
      *in_RSI = ((dVar8 / (dVar5 - 2.0)) * dVar6 *
                (dVar9 * 2.0 * dVar6 * dVar6 + -(dVar2 * 3.0 * dVar3) * dVar6 + dVar1)) / dVar7;
      uVar4 = duckdb::Value::DoubleIsFinite(*in_RSI);
      if ((uVar4 & 1) == 0) {
        this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        paVar11 = &local_61;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,"SKEW is out of range!",paVar11);
        duckdb::OutOfRangeException::OutOfRangeException(this,local_60);
        __cxa_throw(this,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
      }
    }
    else {
      *in_RSI = NAN;
    }
  }
  return;
}

Assistant:

static void Finalize(STATE &state, TARGET_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.n <= 2) {
			finalize_data.ReturnNull();
			return;
		}
		double n = state.n;
		double temp = 1 / n;
		auto p = std::pow(temp * (state.sum_sqr - state.sum * state.sum * temp), 3);
		if (p < 0) {
			p = 0; // Shouldn't be below 0 but floating points are weird
		}
		double div = std::sqrt(p);
		if (div == 0) {
			target = NAN;
			return;
		}
		double temp1 = std::sqrt(n * (n - 1)) / (n - 2);
		target = temp1 * temp *
		         (state.sum_cub - 3 * state.sum_sqr * state.sum * temp + 2 * pow(state.sum, 3) * temp * temp) / div;
		if (!Value::DoubleIsFinite(target)) {
			throw OutOfRangeException("SKEW is out of range!");
		}
	}